

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::SourceCodeInfo_Location
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  Arena *value;
  SourceCodeInfo_Location *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_fffffffffffffed8;
  SourceCodeInfo_Location *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  RepeatedField<int> *in_stack_fffffffffffffef0;
  ArenaStringPtr *this_01;
  
  Message::Message(&in_stack_fffffffffffffee0->super_Message);
  *in_RDI = &PTR__SourceCodeInfo_Location_00964170;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x52cb94);
  RepeatedField<int>::RepeatedField
            (in_stack_fffffffffffffef0,(RepeatedField<int> *)in_stack_fffffffffffffee8);
  RepeatedField<int>::RepeatedField
            (in_stack_fffffffffffffef0,(RepeatedField<int> *)in_stack_fffffffffffffee8);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffef0,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffee8);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_fffffffffffffee0,
               (UnknownFieldSet *)in_stack_fffffffffffffed8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xc),psVar2);
  bVar1 = _internal_has_leading_comments(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_leading_comments_abi_cxx11_((SourceCodeInfo_Location *)0x52cdac);
    GetArenaNoVirtual(in_stack_fffffffffffffee0);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (string *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0xd),psVar2);
  bVar1 = _internal_has_trailing_comments(in_RSI);
  if (bVar1) {
    this_01 = (ArenaStringPtr *)(in_RDI + 0xd);
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    psVar2 = _internal_trailing_comments_abi_cxx11_((SourceCodeInfo_Location *)0x52cee6);
    value = GetArenaNoVirtual(in_stack_fffffffffffffee0);
    internal::ArenaStringPtr::Set(this_01,psVar2,(string *)value,in_stack_fffffffffffffed8);
  }
  return;
}

Assistant:

SourceCodeInfo_Location::SourceCodeInfo_Location(const SourceCodeInfo_Location& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      path_(from.path_),
      span_(from.span_),
      leading_detached_comments_(from.leading_detached_comments_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  leading_comments_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_leading_comments()) {
    leading_comments_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_leading_comments(),
      GetArenaNoVirtual());
  }
  trailing_comments_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_trailing_comments()) {
    trailing_comments_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_trailing_comments(),
      GetArenaNoVirtual());
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.SourceCodeInfo.Location)
}